

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::FeatureIndex::buildBigramFeature
          (FeatureIndex *this,LearnerPath *path,char *rfeature,char *lfeature)

{
  pointer piVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char **out;
  size_t max;
  size_t max_00;
  ostream *poVar5;
  int *__dest;
  pointer ppcVar6;
  size_t sVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *__buf_01;
  size_t __n;
  StringBuffer *this_00;
  char *pcVar8;
  FeatureIndex *pFVar9;
  int id;
  char *p;
  FeatureIndex *local_b8;
  FeatureIndex *local_b0;
  scoped_fixed_array<char_*,_64> R;
  scoped_fixed_array<char_*,_64> L;
  scoped_fixed_array<char,_2048> rbuf;
  scoped_fixed_array<char,_2048> lbuf;
  
  rbuf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016c0b8;
  pcVar3 = (char *)operator_new__(0x800);
  rbuf.size_ = 0x800;
  lbuf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016c0b8;
  rbuf.ptr_ = pcVar3;
  pcVar4 = (char *)operator_new__(0x800);
  lbuf.size_ = 0x800;
  R._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bcd0;
  lbuf.ptr_ = pcVar4;
  R.ptr_ = (char **)operator_new__(0x200);
  R.size_ = 0x40;
  L._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bcd0;
  out = (char **)operator_new__(0x200);
  L.size_ = 0x40;
  piVar1 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar1) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  L.ptr_ = out;
  strncpy(pcVar4,rfeature,0x800);
  strncpy(pcVar3,lfeature,0x800);
  max = tokenizeCSV<char**>(pcVar4,out,0x40);
  pFVar9 = (FeatureIndex *)rbuf.ptr_;
  max_00 = tokenizeCSV<char**>(rbuf.ptr_,R.ptr_,R.size_);
  local_b0 = (FeatureIndex *)&this->feature_;
  ppcVar6 = (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->os_;
  __buf_01 = extraout_RDX;
  local_b8 = this;
LAB_001388d8:
  if (ppcVar6 ==
      (local_b8->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    p = (char *)CONCAT44(p._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)local_b0,(int *)&p);
    pFVar9 = local_b8;
    __dest = ChunkFreeList<int>::alloc
                       (&local_b8->feature_freelist_,
                        (long)(local_b8->feature_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_b8->feature_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
    path->fvector = __dest;
    piVar1 = (pFVar9->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(pFVar9->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
    if (__n != 0) {
      memmove(__dest,piVar1,__n);
      piVar1 = (pFVar9->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pFVar9->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        (pFVar9->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
    }
    scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&L);
    scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&R);
    scoped_fixed_array<char,_2048>::~scoped_fixed_array(&lbuf);
    scoped_fixed_array<char,_2048>::~scoped_fixed_array(&rbuf);
    return true;
  }
  pcVar3 = *ppcVar6;
  (local_b8->os_).size_ = 0;
  do {
    cVar2 = *pcVar3;
    if (cVar2 == '%') {
      pcVar4 = pcVar3 + 1;
      cVar2 = pcVar3[1];
      pcVar8 = rfeature;
      p = pcVar4;
      if (cVar2 == 'r') {
LAB_00138990:
        pFVar9 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)pcVar8,__buf_01,(size_t)pcVar3);
        __buf_01 = extraout_RDX_03;
      }
      else if (cVar2 == 'R') {
        sVar7 = max_00;
        pcVar3 = getIndex(pFVar9,&p,R.ptr_,max_00);
        __buf_01 = __buf_00;
        if (pcVar3 == (char *)0x0) goto LAB_00138a8b;
        pFVar9 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)pcVar3,__buf_00,sVar7);
        __buf_01 = extraout_RDX_04;
      }
      else {
        pcVar8 = lfeature;
        if (cVar2 == 'l') goto LAB_00138990;
        if (cVar2 == 'L') {
          sVar7 = max;
          pcVar3 = getIndex(pFVar9,&p,L.ptr_,max);
          __buf_01 = __buf;
          if (pcVar3 == (char *)0x0) goto LAB_00138a8b;
          pFVar9 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,(int)pcVar3,__buf,sVar7);
          __buf_01 = extraout_RDX_02;
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,"(");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a3);
          poVar5 = std::operator<<(poVar5,") [");
          poVar5 = std::operator<<(poVar5,"false");
          poVar5 = std::operator<<(poVar5,"] ");
          poVar5 = std::operator<<(poVar5,"unknown meta char: ");
          std::operator<<(poVar5,*pcVar4);
          pFVar9 = (FeatureIndex *)&id;
          die::~die((die *)pFVar9);
          __buf_01 = extraout_RDX_05;
        }
      }
    }
    else {
      if (cVar2 == '\\') {
        p = pcVar3 + 1;
        cVar2 = getEscapedChar(pcVar3[1]);
        __buf_01 = extraout_RDX_00;
      }
      else {
        p = pcVar3;
        if (cVar2 == '\0') break;
      }
      pFVar9 = (FeatureIndex *)this_00;
      StringBuffer::write(this_00,(int)cVar2,__buf_01,(size_t)pcVar3);
      __buf_01 = extraout_RDX_01;
    }
    pcVar3 = p + 1;
  } while( true );
  StringBuffer::write(this_00,0,__buf_01,(size_t)pcVar3);
  pFVar9 = local_b8;
  id = (*local_b8->_vptr_FeatureIndex[6])();
  __buf_01 = extraout_RDX_06;
  if (id != -1) {
    pFVar9 = local_b0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_b0,&id);
    __buf_01 = extraout_RDX_07;
  }
LAB_00138a8b:
  ppcVar6 = ppcVar6 + 1;
  goto LAB_001388d8;
}

Assistant:

bool FeatureIndex::buildBigramFeature(LearnerPath *path,
                                      const char *rfeature,
                                      const char *lfeature) {
  scoped_fixed_array<char, BUFSIZE> rbuf;
  scoped_fixed_array<char, BUFSIZE> lbuf;
  scoped_fixed_array<char *, POSSIZE> R;
  scoped_fixed_array<char *, POSSIZE> L;

  feature_.clear();
  std::strncpy(lbuf.get(),  rfeature, lbuf.size());
  std::strncpy(rbuf.get(),  lfeature, rbuf.size());

  const size_t lsize = tokenizeCSV(lbuf.get(), L.get(), L.size());
  const size_t rsize = tokenizeCSV(rbuf.get(), R.get(), R.size());

  for (std::vector<const char*>::const_iterator it = bigram_templs_.begin();
       it != bigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'L': {
              const char *r = getIndex(const_cast<char **>(&p), L.get(), lsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'R': {
              const char *r = getIndex(const_cast<char **>(&p), R.get(), rsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'l':  os_ << lfeature; break;  // use lfeature as it is
            case 'r':  os_ << rfeature; break;
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';

    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->fvector);

  return true;
}